

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O3

void add_region(level *lev,region *reg)

{
  char cVar1;
  uint uVar2;
  region **__src;
  monst *mon;
  bool bVar3;
  boolean bVar4;
  byte bVar5;
  uint uVar6;
  region **__dest;
  char cVar7;
  int iVar8;
  uint y;
  ulong local_48;
  
  iVar8 = lev->n_regions;
  uVar2 = lev->max_regions;
  if ((int)uVar2 <= iVar8) {
    __src = lev->regions;
    __dest = (region **)malloc((long)(int)uVar2 * 8 + 0x50);
    lev->regions = __dest;
    if (0 < (int)uVar2) {
      memcpy(__dest,__src,(ulong)uVar2 << 3);
      free(__src);
      iVar8 = lev->n_regions;
      uVar2 = lev->max_regions;
    }
    lev->max_regions = uVar2 + 10;
  }
  reg->lev = lev;
  lev->regions[iVar8] = reg;
  lev->n_regions = iVar8 + 1;
  cVar1 = (reg->bounding_box).lx;
  cVar7 = (reg->bounding_box).hx;
  if (cVar1 <= cVar7) {
    uVar6 = (uint)(byte)(reg->bounding_box).hy;
    uVar2 = (int)cVar1;
    do {
      local_48 = (ulong)uVar2;
      cVar1 = (reg->bounding_box).ly;
      if (cVar1 <= (char)uVar6) {
        y = (int)cVar1;
        do {
          if (y < 0x15 && uVar2 - 1 < 0x4f) {
            mon = lev->monsters[local_48][y];
            if (((mon != (monst *)0x0) && ((mon->field_0x61 & 2) == 0)) &&
               (bVar4 = inside_region(reg,uVar2,y), bVar4 != '\0')) {
              add_mon_to_reg(reg,mon);
            }
            if ((reg->visible != '\0') && ((viz_array[y][local_48] & 2U) != 0)) {
              newsym(uVar2,y);
            }
          }
          uVar6 = (uint)(reg->bounding_box).hy;
          bVar3 = (int)y < (int)uVar6;
          y = y + 1;
        } while (bVar3);
        cVar7 = (reg->bounding_box).hx;
      }
      bVar3 = (int)uVar2 < (int)cVar7;
      uVar2 = uVar2 + 1;
    } while (bVar3);
  }
  bVar5 = inside_region(reg,(int)u.ux,(int)u.uy);
  reg->player_flags = reg->player_flags & 0xfeU | bVar5;
  return;
}

Assistant:

void add_region(struct level *lev, struct region *reg)
{
    struct region **tmp_reg;
    int i, j;

    if (lev->max_regions <= lev->n_regions) {
	tmp_reg = lev->regions;
	lev->regions = malloc(sizeof (struct region *) * (lev->max_regions + 10));
	if (lev->max_regions > 0) {
	    memcpy(lev->regions, tmp_reg,
			  lev->max_regions * sizeof (struct region *));
	    free(tmp_reg);
	}
	lev->max_regions += 10;
    }
    reg->lev = lev;
    lev->regions[lev->n_regions] = reg;
    lev->n_regions++;
    /* Check for monsters inside the region */
    for (i = reg->bounding_box.lx; i <= reg->bounding_box.hx; i++)
	for (j = reg->bounding_box.ly; j <= reg->bounding_box.hy; j++) {
	    /* Some lev->regions can cross the level boundaries */
	    if (!isok(i,j))
		continue;
	    if (MON_AT(lev, i, j) && inside_region(reg, i, j))
		add_mon_to_reg(reg, lev->monsters[i][j]);
	    if (reg->visible && cansee(i, j))
		newsym(i, j);
	}
    /* Check for player now... */
    if (inside_region(reg, u.ux, u.uy))
	set_hero_inside(reg);
    else
	clear_hero_inside(reg);
}